

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
libcellml::Parser::ParserImpl::loadImport
          (ParserImpl *this,ImportSourcePtr *importSource,ModelPtr *model,XmlNodePtr *node)

{
  ImportSource *this_00;
  IssueImpl *pIVar1;
  ComponentPtr *pCVar2;
  element_type *peVar3;
  bool bVar4;
  bool bVar5;
  undefined8 uVar6;
  string *this_01;
  IssuePtr issue_1;
  XmlAttributePtr childAttribute;
  XmlNodePtr childNode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string textNode;
  ComponentPtr importedComponent;
  IssuePtr issue;
  IssuePtr issue_3;
  IssuePtr issue_2;
  string local_f0;
  XmlAttributePtr attribute;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined8 local_a0;
  ModelPtr *local_98;
  string local_90;
  string local_70;
  string id;
  
  local_98 = model;
  XmlNode::firstAttribute((XmlNode *)&attribute);
  id._M_dataplus._M_p = (pointer)&id.field_2;
  id._M_string_length = 0;
  id.field_2._M_local_buf[0] = '\0';
  local_a0 = (IssueImpl *)((ulong)local_a0._4_4_ << 0x20);
  while (attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0) {
    bVar4 = XmlAttribute::isType
                      (attribute.
                       super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,"href","http://www.w3.org/1999/xlink");
    if (bVar4) {
      this_00 = (importSource->
                super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      XmlAttribute::value_abi_cxx11_
                (&textNode,
                 attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      ImportSource::setUrl(this_00,&textNode);
      uVar6 = std::__cxx11::string::~string((string *)&textNode);
      local_a0 = (IssueImpl *)CONCAT44(local_a0._4_4_,(int)CONCAT71((int7)((ulong)uVar6 >> 8),1));
    }
    else {
      bVar4 = isIdAttribute(&attribute,this->mParsing1XVersion);
      if (bVar4) {
        XmlAttribute::value_abi_cxx11_
                  (&textNode,
                   attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        std::__cxx11::string::operator=((string *)&id,(string *)&textNode);
        std::__cxx11::string::~string((string *)&textNode);
        Entity::setId(&((importSource->
                        super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->super_Entity,&id);
      }
      else {
        bVar4 = XmlAttribute::inNamespaceUri
                          (attribute.
                           super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,"http://www.w3.org/1999/xlink");
        if (!bVar4) {
          Issue::IssueImpl::create();
          pIVar1 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   mPimpl;
          XmlNode::attribute_abi_cxx11_
                    (&local_f0,
                     (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,"href");
          std::operator+(&local_c0,"Import from \'",&local_f0);
          std::operator+(&local_190,&local_c0,"\' has an invalid attribute \'");
          XmlAttribute::name_abi_cxx11_
                    ((string *)&issue_2,
                     attribute.
                     super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_1,&local_190,(string *)&issue_2);
          std::operator+(&textNode,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_1,"\'.");
          Issue::IssueImpl::setDescription(pIVar1,&textNode);
          std::__cxx11::string::~string((string *)&textNode);
          std::__cxx11::string::~string((string *)&issue_1);
          std::__cxx11::string::~string((string *)&issue_2);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_c0);
          std::__cxx11::string::~string((string *)&local_f0);
          AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                    ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl->mItem).
                      super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,importSource);
          Issue::IssueImpl::setReferenceRule
                    ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->mPimpl,IMPORT_ELEMENT);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
      }
    }
    XmlAttribute::next((XmlAttribute *)&textNode);
    std::__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2> *)&textNode);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&textNode._M_string_length);
  }
  if (((ulong)local_a0 & 1) == 0) {
    Issue::IssueImpl::create();
    pIVar1 = (issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&textNode,"Import does not specify an xlink:href attribute.",
               (allocator<char> *)&local_190);
    Issue::IssueImpl::setDescription(pIVar1,&textNode);
    std::__cxx11::string::~string((string *)&textNode);
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource
              ((((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl,importSource);
    Issue::IssueImpl::setReferenceRule
              ((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,IMPORT_HREF);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
  XmlNode::firstChild((XmlNode *)&childNode);
  if (childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    Issue::IssueImpl::create();
    pIVar1 = (issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl;
    if (id._M_string_length == 0) {
      XmlNode::attribute_abi_cxx11_
                (&local_190,
                 (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 "href");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_1,
                     "Import from \'",&local_190);
      std::operator+(&textNode,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_1,
                     "\' is empty and will be disregarded.");
      Issue::IssueImpl::setDescription(pIVar1,&textNode);
      std::__cxx11::string::~string((string *)&textNode);
      std::__cxx11::string::~string((string *)&issue_1);
      this_01 = &local_190;
    }
    else {
      XmlNode::attribute_abi_cxx11_
                (&local_f0,
                 (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 "href");
      std::operator+(&local_c0,"Import from \'",&local_f0);
      std::operator+(&local_190,&local_c0,"\' has an identifier of \'");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_1,
                     &local_190,&id);
      std::operator+(&textNode,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_1,
                     "\' but is empty. The import will be disregarded and the associated identifier will be lost."
                    );
      Issue::IssueImpl::setDescription(pIVar1,&textNode);
      std::__cxx11::string::~string((string *)&textNode);
      std::__cxx11::string::~string((string *)&issue_1);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_c0);
      this_01 = &local_f0;
    }
    std::__cxx11::string::~string((string *)this_01);
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource
              ((((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl,importSource);
    Issue::IssueImpl::setLevel
              ((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,WARNING);
    Issue::IssueImpl::setReferenceRule
              ((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,IMPORT_CHILD);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
  do {
    if (childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)&id);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return;
    }
    bVar4 = parseNode(this,&childNode,"component");
    if (bVar4) {
      Component::create();
      XmlNode::firstAttribute
                ((XmlNode *)
                 &childAttribute.
                  super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>);
      ImportedEntity::setImportSource
                (&(importedComponent.
                   super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_ImportedEntity,importSource);
      bVar4 = false;
      while (childAttribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr != (element_type *)0x0) {
        bVar5 = XmlAttribute::isType
                          (childAttribute.
                           super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,"name","");
        peVar3 = importedComponent.
                 super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (bVar5) {
          XmlAttribute::value_abi_cxx11_
                    (&textNode,
                     childAttribute.
                     super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          NamedEntity::setName((NamedEntity *)peVar3,&textNode);
          std::__cxx11::string::~string((string *)&textNode);
          bVar4 = true;
        }
        else {
          bVar5 = isIdAttribute((XmlAttributePtr *)
                                &childAttribute.
                                 super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                                ,this->mParsing1XVersion);
          peVar3 = importedComponent.
                   super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (bVar5) {
            XmlAttribute::value_abi_cxx11_
                      (&textNode,
                       childAttribute.
                       super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            Entity::setId((Entity *)peVar3,&textNode);
          }
          else {
            bVar5 = XmlAttribute::isType
                              (childAttribute.
                               super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,"component_ref","");
            peVar3 = importedComponent.
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (!bVar5) {
              Issue::IssueImpl::create();
              pIVar1 = (issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl;
              XmlNode::attribute_abi_cxx11_
                        ((string *)&issue,
                         childNode.
                         super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         "name");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &issue_2,"Import of component \'",(string *)&issue);
              std::operator+(&local_f0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &issue_2,"\' from \'");
              XmlNode::attribute_abi_cxx11_
                        (&local_70,
                         (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr,"href");
              std::operator+(&local_c0,&local_f0,&local_70);
              std::operator+(&local_190,&local_c0,"\' has an invalid attribute \'");
              XmlAttribute::name_abi_cxx11_
                        (&local_90,
                         childAttribute.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &issue_1,&local_190,&local_90);
              std::operator+(&textNode,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &issue_1,"\'.");
              Issue::IssueImpl::setDescription(pIVar1,&textNode);
              std::__cxx11::string::~string((string *)&textNode);
              std::__cxx11::string::~string((string *)&issue_1);
              std::__cxx11::string::~string((string *)&local_90);
              std::__cxx11::string::~string((string *)&local_190);
              std::__cxx11::string::~string((string *)&local_c0);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&local_f0);
              std::__cxx11::string::~string((string *)&issue_2);
              std::__cxx11::string::~string((string *)&issue);
              AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                        ((((issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->mPimpl->mItem).
                          super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,importSource);
              Issue::IssueImpl::setReferenceRule
                        ((issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl,IMPORT_COMPONENT_ELEMENT);
              Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_3);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              goto LAB_001fbd23;
            }
            XmlAttribute::value_abi_cxx11_
                      (&textNode,
                       childAttribute.
                       super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            ImportedEntity::setImportReference(&peVar3->super_ImportedEntity,&textNode);
          }
          std::__cxx11::string::~string((string *)&textNode);
        }
LAB_001fbd23:
        XmlAttribute::next((XmlAttribute *)&textNode);
        std::__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&childAttribute.
                    super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2> *)&textNode);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&textNode._M_string_length);
      }
      if (!bVar4) {
        Issue::IssueImpl::create();
        pIVar1 = (issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&textNode,"Import of component does not specify a name attribute.",
                   (allocator<char> *)&local_190);
        Issue::IssueImpl::setDescription(pIVar1,&textNode);
        std::__cxx11::string::~string((string *)&textNode);
        AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                  ((((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,importSource);
        Issue::IssueImpl::setReferenceRule
                  ((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl,IMPORT_COMPONENT_NAME);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      ComponentEntity::addComponent
                (&((local_98->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->super_ComponentEntity,&importedComponent);
LAB_001fc308:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&childAttribute.
                  super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      pCVar2 = &importedComponent;
LAB_001fc31a:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&(pCVar2->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
    }
    else {
      bVar4 = parseNode(this,&childNode,"units");
      if (bVar4) {
        Units::create();
        XmlNode::firstAttribute
                  ((XmlNode *)
                   &childAttribute.
                    super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>);
        ImportedEntity::setImportSource
                  (&(importedComponent.
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_ImportedEntity,importSource);
        bVar4 = false;
        while (childAttribute.
               super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
               (element_type *)0x0) {
          bVar5 = XmlAttribute::isType
                            (childAttribute.
                             super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,"name","");
          peVar3 = importedComponent.
                   super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (bVar5) {
            XmlAttribute::value_abi_cxx11_
                      (&textNode,
                       childAttribute.
                       super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            NamedEntity::setName((NamedEntity *)peVar3,&textNode);
            std::__cxx11::string::~string((string *)&textNode);
            bVar4 = true;
          }
          else {
            bVar5 = isIdAttribute((XmlAttributePtr *)
                                  &childAttribute.
                                   super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                                  ,this->mParsing1XVersion);
            peVar3 = importedComponent.
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (bVar5) {
              XmlAttribute::value_abi_cxx11_
                        (&textNode,
                         childAttribute.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
              Entity::setId((Entity *)peVar3,&textNode);
            }
            else {
              bVar5 = XmlAttribute::isType
                                (childAttribute.
                                 super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,"units_ref","");
              peVar3 = importedComponent.
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              if (!bVar5) {
                Issue::IssueImpl::create();
                pIVar1 = (issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl;
                XmlNode::attribute_abi_cxx11_
                          ((string *)&issue,
                           childNode.
                           super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           ,"name");
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &issue_2,"Import of units \'",(string *)&issue);
                std::operator+(&local_f0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &issue_2,"\' from \'");
                XmlNode::attribute_abi_cxx11_
                          (&local_70,
                           (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr,"href");
                std::operator+(&local_c0,&local_f0,&local_70);
                std::operator+(&local_190,&local_c0,"\' has an invalid attribute \'");
                XmlAttribute::name_abi_cxx11_
                          (&local_90,
                           childAttribute.
                           super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &issue_1,&local_190,&local_90);
                std::operator+(&textNode,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &issue_1,"\'.");
                Issue::IssueImpl::setDescription(pIVar1,&textNode);
                std::__cxx11::string::~string((string *)&textNode);
                std::__cxx11::string::~string((string *)&issue_1);
                std::__cxx11::string::~string((string *)&local_90);
                std::__cxx11::string::~string((string *)&local_190);
                std::__cxx11::string::~string((string *)&local_c0);
                std::__cxx11::string::~string((string *)&local_70);
                std::__cxx11::string::~string((string *)&local_f0);
                std::__cxx11::string::~string((string *)&issue_2);
                std::__cxx11::string::~string((string *)&issue);
                AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                          ((((issue_3.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->mPimpl->mItem).
                            super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->mPimpl,importSource);
                Issue::IssueImpl::setReferenceRule
                          ((issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->mPimpl,IMPORT_UNITS_ELEMENT);
                Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_3);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                goto LAB_001fc027;
              }
              XmlAttribute::value_abi_cxx11_
                        (&textNode,
                         childAttribute.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
              ImportedEntity::setImportReference(&peVar3->super_ImportedEntity,&textNode);
            }
            std::__cxx11::string::~string((string *)&textNode);
          }
LAB_001fc027:
          XmlAttribute::next((XmlAttribute *)&textNode);
          std::__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&childAttribute.
                      super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2> *)&textNode)
          ;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&textNode._M_string_length);
        }
        if (!bVar4) {
          Issue::IssueImpl::create();
          pIVar1 = (issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&textNode,"Import of units does not specify a name attribute.",
                     (allocator<char> *)&local_190);
          Issue::IssueImpl::setDescription(pIVar1,&textNode);
          std::__cxx11::string::~string((string *)&textNode);
          AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                    ((((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl->mItem).
                      super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,importSource);
          Issue::IssueImpl::setReferenceRule
                    ((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,IMPORT_UNITS_NAME);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_1);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        Model::addUnits((local_98->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)
                        ._M_ptr,(UnitsPtr *)&importedComponent);
        goto LAB_001fc308;
      }
      bVar4 = XmlNode::isText(childNode.
                              super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
      if (!bVar4) {
        bVar4 = XmlNode::isComment(childNode.
                                   super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
        if (bVar4) goto LAB_001fc31f;
        Issue::IssueImpl::create();
        pIVar1 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl;
        if (this->mParsing1XVersion == true) {
          XmlNode::attribute_abi_cxx11_
                    (&local_f0,
                     (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,"href");
          std::operator+(&local_c0,"Import from \'",&local_f0);
          std::operator+(&local_190,&local_c0,"\' ignoring child element \'");
          XmlNode::name_abi_cxx11_
                    ((string *)&issue_2,
                     childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_1,&local_190,(string *)&issue_2);
          std::operator+(&textNode,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_1,"\'.");
          Issue::IssueImpl::setDescription(pIVar1,&textNode);
          std::__cxx11::string::~string((string *)&textNode);
          std::__cxx11::string::~string((string *)&issue_1);
          std::__cxx11::string::~string((string *)&issue_2);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_c0);
          std::__cxx11::string::~string((string *)&local_f0);
          Issue::IssueImpl::setLevel
                    ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->mPimpl,MESSAGE);
        }
        else {
          XmlNode::attribute_abi_cxx11_
                    (&local_f0,
                     (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,"href");
          std::operator+(&local_c0,"Import from \'",&local_f0);
          std::operator+(&local_190,&local_c0,"\' has an invalid child element \'");
          XmlNode::name_abi_cxx11_
                    ((string *)&issue_2,
                     childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_1,&local_190,(string *)&issue_2);
          std::operator+(&textNode,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_1,"\'.");
          Issue::IssueImpl::setDescription(pIVar1,&textNode);
          std::__cxx11::string::~string((string *)&textNode);
          std::__cxx11::string::~string((string *)&issue_1);
          std::__cxx11::string::~string((string *)&issue_2);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_c0);
          std::__cxx11::string::~string((string *)&local_f0);
          Issue::IssueImpl::setReferenceRule
                    ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->mPimpl,XML_UNEXPECTED_ELEMENT);
        }
        AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                  ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->mPimpl->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,importSource);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
        pCVar2 = (ComponentPtr *)&issue;
        goto LAB_001fc31a;
      }
      XmlNode::convertToString_abi_cxx11_
                (&textNode,
                 childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                );
      bVar4 = hasNonWhitespaceCharacters(&textNode);
      if (bVar4) {
        Issue::IssueImpl::create();
        local_a0 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   mPimpl;
        XmlNode::attribute_abi_cxx11_
                  ((string *)&issue_2,
                   (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                   ,"href");
        std::operator+(&local_f0,"Import from \'",(string *)&issue_2);
        std::operator+(&local_c0,&local_f0,"\' has an invalid non-whitespace child text element \'")
        ;
        std::operator+(&local_190,&local_c0,&textNode);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_1
                       ,&local_190,"\'.");
        Issue::IssueImpl::setDescription
                  (local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &issue_1);
        std::__cxx11::string::~string((string *)&issue_1);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&issue_2);
        AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                  ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->mPimpl->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,importSource);
        Issue::IssueImpl::setReferenceRule
                  ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   mPimpl,XML_UNEXPECTED_CHARACTER);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::__cxx11::string::~string((string *)&textNode);
    }
LAB_001fc31f:
    XmlNode::next((XmlNode *)&textNode);
    std::__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> *)&textNode);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&textNode._M_string_length);
  } while( true );
}

Assistant:

void Parser::ParserImpl::loadImport(ImportSourcePtr &importSource, const ModelPtr &model, const XmlNodePtr &node)
{
    XmlAttributePtr attribute = node->firstAttribute();
    std::string id;
    bool hrefAttributePresent = false;
    while (attribute != nullptr) {
        if (attribute->isType("href", XLINK_NS)) {
            importSource->setUrl(attribute->value());
            hrefAttributePresent = true;
        } else if (isIdAttribute(attribute, mParsing1XVersion)) {
            id = attribute->value();
            importSource->setId(id);
        } else if (attribute->inNamespaceUri(XLINK_NS)) {
            // Allow xlink attributes but do nothing for them.
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Import from '" + node->attribute("href") + "' has an invalid attribute '" + attribute->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_ELEMENT);
            addIssue(issue);
        }
        attribute = attribute->next();
    }

    if (!hrefAttributePresent) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Import does not specify an xlink:href attribute.");
        issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_HREF);
        addIssue(issue);
    }

    XmlNodePtr childNode = node->firstChild();

    if (childNode == nullptr) {
        auto issue = Issue::IssueImpl::create();
        if (id.empty()) {
            issue->mPimpl->setDescription("Import from '" + node->attribute("href") + "' is empty and will be disregarded.");
        } else {
            issue->mPimpl->setDescription("Import from '" + node->attribute("href") + "' has an identifier of '" + id + "' but is empty. The import will be disregarded and the associated identifier will be lost.");
        }
        issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
        issue->mPimpl->setLevel(libcellml::Issue::Level::WARNING);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_CHILD);
        addIssue(issue);
    }
    bool nameAttributePresent;
    while (childNode != nullptr) {
        if (parseNode(childNode, "component")) {
            ComponentPtr importedComponent = Component::create();
            XmlAttributePtr childAttribute = childNode->firstAttribute();
            importedComponent->setImportSource(importSource);
            nameAttributePresent = false;
            while (childAttribute) {
                if (childAttribute->isType("name")) {
                    importedComponent->setName(childAttribute->value());
                    nameAttributePresent = true;
                } else if (isIdAttribute(childAttribute, mParsing1XVersion)) {
                    importedComponent->setId(childAttribute->value());
                } else if (childAttribute->isType("component_ref")) {
                    importedComponent->setImportReference(childAttribute->value());
                } else {
                    auto issue = Issue::IssueImpl::create();
                    issue->mPimpl->setDescription("Import of component '" + childNode->attribute("name") + "' from '" + node->attribute("href") + "' has an invalid attribute '" + childAttribute->name() + "'.");
                    issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
                    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_COMPONENT_ELEMENT);
                    addIssue(issue);
                }
                childAttribute = childAttribute->next();
            }

            if (!nameAttributePresent) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Import of component does not specify a name attribute.");
                issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_COMPONENT_NAME);
                addIssue(issue);
            }

            model->addComponent(importedComponent);
        } else if (parseNode(childNode, "units")) {
            UnitsPtr importedUnits = Units::create();
            XmlAttributePtr childAttribute = childNode->firstAttribute();
            importedUnits->setImportSource(importSource);
            nameAttributePresent = false;
            while (childAttribute) {
                if (childAttribute->isType("name")) {
                    importedUnits->setName(childAttribute->value());
                    nameAttributePresent = true;
                } else if (isIdAttribute(childAttribute, mParsing1XVersion)) {
                    importedUnits->setId(childAttribute->value());
                } else if (childAttribute->isType("units_ref")) {
                    importedUnits->setImportReference(childAttribute->value());
                } else {
                    auto issue = Issue::IssueImpl::create();
                    issue->mPimpl->setDescription("Import of units '" + childNode->attribute("name") + "' from '" + node->attribute("href") + "' has an invalid attribute '" + childAttribute->name() + "'.");
                    issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
                    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_ELEMENT);
                    addIssue(issue);
                }
                childAttribute = childAttribute->next();
            }

            if (!nameAttributePresent) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Import of units does not specify a name attribute.");
                issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_NAME);
                addIssue(issue);
            }

            model->addUnits(importedUnits);
        } else if (childNode->isText()) {
            const std::string textNode = childNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Import from '" + node->attribute("href") + "' has an invalid non-whitespace child text element '" + textNode + "'.");
                issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            }
        } else if (childNode->isComment()) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            if (mParsing1XVersion) {
                issue->mPimpl->setDescription("Import from '" + node->attribute("href") + "' ignoring child element '" + childNode->name() + "'.");
                issue->mPimpl->setLevel(Issue::Level::MESSAGE);
            } else {
                issue->mPimpl->setDescription("Import from '" + node->attribute("href") + "' has an invalid child element '" + childNode->name() + "'.");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_ELEMENT);
            }
            issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
            addIssue(issue);
        }
        childNode = childNode->next();
    }
}